

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void fdump_attr_list(void *file,attr_list list)

{
  long in_RSI;
  FILE *in_RDI;
  FILE *out;
  FILE *list_00;
  
  list_00 = in_RDI;
  atl_lock();
  init_global_atom_server((atom_server *)0x106688);
  atl_unlock();
  fprintf(in_RDI,"Attribute list %p, ref_count = %d\n",in_RSI,
          (ulong)(uint)(int)*(short *)(in_RSI + 2));
  internal_dump_attr_list(out,(attr_list)list_00,(int)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

extern void
fdump_attr_list(void *file, attr_list list)
{
    FILE *out = (FILE*)file;
    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();
    fprintf(out, "Attribute list %p, ref_count = %d\n", list, list->ref_count);
    internal_dump_attr_list(out, list, 0);
}